

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O0

Vector<int,_3> __thiscall tcu::Vector<int,_4>::toWidth<3>(Vector<int,_4> *this)

{
  int iVar1;
  int extraout_EDX;
  long in_RSI;
  Vector<int,_3> VVar2;
  int local_1c;
  int i;
  Vector<int,_4> *this_local;
  Vector<int,_3> *res;
  
  Vector<int,_3>::Vector((Vector<int,_3> *)this);
  for (local_1c = 0; iVar1 = deMin32(4,3), local_1c < iVar1; local_1c = local_1c + 1) {
    this->m_data[local_1c] = *(int *)(in_RSI + (long)local_1c * 4);
  }
  for (; local_1c < 3; local_1c = local_1c + 1) {
    this->m_data[local_1c] = 0;
  }
  VVar2.m_data[2] = extraout_EDX;
  VVar2.m_data._0_8_ = this;
  return (Vector<int,_3>)VVar2.m_data;
}

Assistant:

inline Vector<T, NewSize> Vector<T, Size>::toWidth (void) const
{
	Vector<T, NewSize> res;
	int i;
	for (i = 0; i < deMin32(Size, NewSize); i++)
		res.m_data[i] = m_data[i];
	for (; i < NewSize; i++)
		res.m_data[i] = T(0);
	return res;
}